

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O2

uint lodepng::decode(vector<unsigned_char,_std::allocator<unsigned_char>_> *out,uint *w,uint *h,
                    string *filename,LodePNGColorType colortype,uint bitdepth)

{
  uint uVar1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> buffer;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_48;
  
  local_48._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  *h = 0;
  *w = 0;
  uVar1 = load_file((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_48,filename);
  if (uVar1 == 0) {
    uVar1 = decode(out,w,h,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_48,
                   colortype,bitdepth);
  }
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_48);
  return uVar1;
}

Assistant:

unsigned decode(std::vector<unsigned char>& out, unsigned& w, unsigned& h, const std::string& filename,
                LodePNGColorType colortype, unsigned bitdepth) {
  std::vector<unsigned char> buffer;
  /* safe output values in case error happens */
  w = h = 0;
  unsigned error = load_file(buffer, filename);
  if(error) return error;
  return decode(out, w, h, buffer, colortype, bitdepth);
}